

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.h
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(ConfidentialTxOutReference *this)

{
  ~ConfidentialTxOutReference(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ConfidentialTxOutReference() {
    // do nothing
  }